

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmQtAutoGenInitializer.cxx
# Opt level: O2

bool __thiscall cmQtAutoGenInitializer::InitCustomTargets(cmQtAutoGenInitializer *this)

{
  cmGeneratorTarget *pcVar1;
  key_type *pkVar2;
  bool bVar3;
  byte bVar4;
  int iVar5;
  PolicyStatus PVar6;
  uint uVar7;
  cmMakefile *this_00;
  cmLocalGenerator *pcVar8;
  cmState *pcVar9;
  char *pcVar10;
  string *psVar11;
  mapped_type *pmVar12;
  string *cfg_1;
  key_type *__k;
  string *cfg;
  pointer pbVar13;
  pointer pbVar14;
  unsigned_long iVerb;
  size_type local_98;
  string *local_80;
  cmMakefile *local_78;
  allocator<char> local_69;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  extraDeps;
  cmTarget *depTarget;
  string *local_40;
  string *local_38;
  
  this_00 = cmTarget::GetMakefile(this->Target->Target);
  pcVar8 = cmGeneratorTarget::GetLocalGenerator(this->Target);
  iVar5 = (*pcVar8->GlobalGenerator->_vptr_cmGlobalGenerator[0x23])();
  this->MultiConfig = SUB41(iVar5,0);
  local_78 = this_00;
  cmMakefile::GetConfigurations((string *)&iVerb,this_00,&this->ConfigsList,true);
  std::__cxx11::string::operator=((string *)&this->ConfigDefault,(string *)&iVerb);
  std::__cxx11::string::~string((string *)&iVerb);
  if ((this->ConfigsList).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      (this->ConfigsList).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&this->ConfigsList,&this->ConfigDefault);
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&iVerb,"CMAKE_AUTOGEN_VERBOSE",(allocator<char> *)&extraDeps);
  cmMakefile::GetSafeDefinition(local_78,(string *)&iVerb);
  psVar11 = &this->Verbosity;
  std::__cxx11::string::_M_assign((string *)psVar11);
  std::__cxx11::string::~string((string *)&iVerb);
  if ((this->Verbosity)._M_string_length != 0) {
    iVerb = 0;
    bVar3 = cmSystemTools::StringToULong((psVar11->_M_dataplus)._M_p,&iVerb);
    if (!bVar3) {
      cmSystemTools::IsOn(psVar11);
      std::__cxx11::string::assign((char *)psVar11);
    }
  }
  pcVar9 = cmMakefile::GetState(local_78);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&iVerb,"AUTOMOC_TARGETS_FOLDER",(allocator<char> *)&extraDeps);
  pcVar10 = cmState::GetGlobalProperty(pcVar9,(string *)&iVerb);
  std::__cxx11::string::~string((string *)&iVerb);
  if (pcVar10 == (char *)0x0) {
    pcVar9 = cmMakefile::GetState(local_78);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&iVerb,"AUTOGEN_TARGETS_FOLDER",(allocator<char> *)&extraDeps);
    pcVar10 = cmState::GetGlobalProperty(pcVar9,(string *)&iVerb);
    std::__cxx11::string::~string((string *)&iVerb);
    if (pcVar10 == (char *)0x0) {
      pcVar1 = this->Target;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&iVerb,"FOLDER",(allocator<char> *)&extraDeps);
      pcVar10 = cmGeneratorTarget::GetProperty(pcVar1,(string *)&iVerb);
      std::__cxx11::string::~string((string *)&iVerb);
      if (pcVar10 == (char *)0x0) goto LAB_001b2970;
    }
  }
  std::__cxx11::string::assign((char *)&this->TargetsFolder);
LAB_001b2970:
  PVar6 = cmMakefile::GetPolicyStatus(local_78,CMP0071,false);
  if (PVar6 - NEW < 3) {
    this->CMP0071Accept = true;
  }
  else if (PVar6 == WARN) {
    this->CMP0071Warn = true;
  }
  extraDeps.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (pointer)&extraDeps.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage;
  extraDeps.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  extraDeps.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (pointer)((ulong)extraDeps.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage & 0xffffffffffffff00);
  psVar11 = cmMakefile::GetCurrentBinaryDirectory_abi_cxx11_(local_78);
  cmsys::SystemTools::CollapseFullPath((string *)&iVerb,(string *)&extraDeps,psVar11);
  std::__cxx11::string::~string((string *)&extraDeps);
  local_80 = &(this->Dir).Info;
  std::__cxx11::string::_M_assign((string *)local_80);
  std::__cxx11::string::append((char *)local_80);
  std::__cxx11::string::push_back((char)local_80);
  cmGeneratorTarget::GetName_abi_cxx11_(this->Target);
  std::__cxx11::string::append((string *)local_80);
  std::__cxx11::string::append((char *)local_80);
  std::__cxx11::string::append((char *)local_80);
  cmsys::SystemTools::ConvertToUnixSlashes(local_80);
  pcVar1 = this->Target;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&extraDeps,"AUTOGEN_BUILD_DIR",(allocator<char> *)&depTarget);
  cmGeneratorTarget::GetSafeProperty(pcVar1,(string *)&extraDeps);
  psVar11 = &(this->Dir).Build;
  std::__cxx11::string::assign((char *)psVar11);
  std::__cxx11::string::~string((string *)&extraDeps);
  if ((this->Dir).Build._M_string_length == 0) {
    std::__cxx11::string::_M_assign((string *)psVar11);
    std::__cxx11::string::push_back((char)psVar11);
    cmGeneratorTarget::GetName_abi_cxx11_(this->Target);
    std::__cxx11::string::append((string *)psVar11);
    std::__cxx11::string::append((char *)psVar11);
  }
  cmsys::SystemTools::ConvertToUnixSlashes(psVar11);
  AddCleanFile(this,psVar11);
  psVar11 = &(this->Dir).Work;
  std::__cxx11::string::_M_assign((string *)psVar11);
  cmsys::SystemTools::ConvertToUnixSlashes(psVar11);
  psVar11 = &(this->Dir).Include;
  std::__cxx11::string::_M_assign((string *)psVar11);
  std::__cxx11::string::append((char *)psVar11);
  bVar4 = this->MultiConfig;
  local_40 = psVar11;
  if ((bool)bVar4 == true) {
    std::__cxx11::string::append((char *)psVar11);
    bVar4 = this->MultiConfig;
  }
  if ((bVar4 & 1) != 0) {
    pbVar14 = (this->ConfigsList).
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    for (pbVar13 = (this->ConfigsList).
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start; pbVar13 != pbVar14;
        pbVar13 = pbVar13 + 1) {
      pmVar12 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator[](&(this->Dir).ConfigInclude,pbVar13);
      std::__cxx11::string::_M_assign((string *)pmVar12);
      std::__cxx11::string::append((char *)pmVar12);
      std::__cxx11::string::append((string *)pmVar12);
    }
  }
  std::__cxx11::string::~string((string *)&iVerb);
  bVar3 = (this->Moc).super_GenVarsT.Enabled;
  bVar4 = (this->Uic).super_GenVarsT.Enabled;
  if (((bVar3 | bVar4) & 1) != 0) {
    if (bVar3 != false) {
      bVar3 = InitMoc(this);
      if (!bVar3) {
        return false;
      }
      bVar4 = (this->Uic).super_GenVarsT.Enabled;
    }
    if (((bVar4 & 1) != 0) && (bVar3 = InitUic(this), !bVar3)) {
      return false;
    }
    cmGeneratorTarget::GetName_abi_cxx11_(this->Target);
    std::__cxx11::string::_M_assign((string *)&this->AutogenTarget);
    std::__cxx11::string::append((char *)&this->AutogenTarget);
    pcVar1 = this->Target;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&iVerb,"AUTOGEN_PARALLEL",(allocator<char> *)&extraDeps);
    cmGeneratorTarget::GetSafeProperty(pcVar1,(string *)&iVerb);
    psVar11 = &(this->AutogenTarget).Parallel;
    std::__cxx11::string::assign((char *)psVar11);
    std::__cxx11::string::~string((string *)&iVerb);
    if (((this->AutogenTarget).Parallel._M_string_length == 0) ||
       (bVar3 = std::operator==(psVar11,"AUTO"), bVar3)) {
      if (GetParallelCPUCount()::count == 0) {
        cmsys::SystemInformation::SystemInformation((SystemInformation *)&iVerb);
        cmsys::SystemInformation::RunCPUCheck((SystemInformation *)&iVerb);
        uVar7 = cmsys::SystemInformation::GetNumberOfPhysicalCPU((SystemInformation *)&iVerb);
        uVar7 = uVar7 + (uVar7 == 0);
        if (0x40 < uVar7) {
          uVar7 = 0x40;
        }
        GetParallelCPUCount()::count = (unsigned_long)uVar7;
        cmsys::SystemInformation::~SystemInformation((SystemInformation *)&iVerb);
      }
      std::__cxx11::to_string((string *)&iVerb,GetParallelCPUCount()::count);
      std::__cxx11::string::operator=((string *)psVar11,(string *)&iVerb);
      std::__cxx11::string::~string((string *)&iVerb);
    }
    psVar11 = &(this->AutogenTarget).InfoFile;
    std::__cxx11::string::_M_assign((string *)psVar11);
    std::__cxx11::string::append((char *)psVar11);
    psVar11 = &(this->AutogenTarget).SettingsFile;
    std::__cxx11::string::_M_assign((string *)psVar11);
    std::__cxx11::string::append((char *)psVar11);
    if (this->MultiConfig == true) {
      pkVar2 = (this->ConfigsList).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      local_38 = psVar11;
      for (__k = (this->ConfigsList).
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start; __k != pkVar2; __k = __k + 1) {
        pmVar12 = std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::operator[](&(this->AutogenTarget).ConfigSettingsFile,__k);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &extraDeps,"_",__k);
        cmQtAutoGen::AppendFilenameSuffix
                  ((string *)&iVerb,local_38,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&extraDeps);
        std::__cxx11::string::operator=((string *)pmVar12,(string *)&iVerb);
        std::__cxx11::string::~string((string *)&iVerb);
        std::__cxx11::string::~string((string *)&extraDeps);
        AddCleanFile(this,pmVar12);
      }
    }
    else {
      AddCleanFile(this,psVar11);
    }
    psVar11 = &(this->AutogenTarget).ParseCacheFile;
    std::__cxx11::string::_M_assign((string *)psVar11);
    std::__cxx11::string::append((char *)psVar11);
    AddCleanFile(this,psVar11);
    pcVar1 = this->Target;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&iVerb,"AUTOGEN_ORIGIN_DEPENDS",(allocator<char> *)&extraDeps);
    bVar3 = cmGeneratorTarget::GetPropertyAsBool(pcVar1,(string *)&iVerb);
    (this->AutogenTarget).DependOrigin = bVar3;
    std::__cxx11::string::~string((string *)&iVerb);
    pcVar1 = this->Target;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&extraDeps,"AUTOGEN_TARGET_DEPENDS",(allocator<char> *)&depTarget);
    pcVar10 = cmGeneratorTarget::GetSafeProperty(pcVar1,(string *)&extraDeps);
    std::__cxx11::string::string<std::allocator<char>>((string *)&iVerb,pcVar10,&local_69);
    std::__cxx11::string::~string((string *)&extraDeps);
    if (local_98 != 0) {
      extraDeps.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      extraDeps.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      extraDeps.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      cmSystemTools::ExpandListArgument((string *)&iVerb,&extraDeps,false);
      pbVar13 = extraDeps.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      for (pbVar14 = extraDeps.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start; pbVar14 != pbVar13;
          pbVar14 = pbVar14 + 1) {
        depTarget = cmMakefile::FindTargetToUse(local_78,pbVar14,false);
        if (depTarget == (cmTarget *)0x0) {
          std::
          _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
          ::_M_insert_unique<std::__cxx11::string_const&>
                    ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                      *)&(this->AutogenTarget).DependFiles,pbVar14);
        }
        else {
          std::
          _Rb_tree<cmTarget*,cmTarget*,std::_Identity<cmTarget*>,std::less<cmTarget*>,std::allocator<cmTarget*>>
          ::_M_insert_unique<cmTarget*const&>
                    ((_Rb_tree<cmTarget*,cmTarget*,std::_Identity<cmTarget*>,std::less<cmTarget*>,std::allocator<cmTarget*>>
                      *)&(this->AutogenTarget).DependTargets,&depTarget);
        }
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&extraDeps);
    }
    std::__cxx11::string::~string((string *)&iVerb);
    if ((this->Moc).super_GenVarsT.Enabled == true) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&iVerb,"CMAKE_AUTOMOC_RELAXED_MODE",(allocator<char> *)&extraDeps);
      pcVar10 = cmMakefile::GetDefinition(local_78,(string *)&iVerb);
      bVar3 = cmSystemTools::IsOn(pcVar10);
      std::__cxx11::string::~string((string *)&iVerb);
      if (bVar3) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&iVerb,
                   "AUTOMOC: CMAKE_AUTOMOC_RELAXED_MODE is deprecated an will be removed in the future.  "
                   ,(allocator<char> *)&extraDeps);
        std::__cxx11::string::append((char *)&iVerb);
        cmGeneratorTarget::GetName_abi_cxx11_(this->Target);
        std::__cxx11::string::append((string *)&iVerb);
        std::__cxx11::string::append((char *)&iVerb);
        cmMakefile::IssueMessage(local_78,AUTHOR_WARNING,(string *)&iVerb);
        std::__cxx11::string::~string((string *)&iVerb);
      }
    }
  }
  if (((this->Rcc).super_GenVarsT.Enabled != true) || (bVar3 = InitRcc(this), bVar3)) {
    if ((((this->Moc).super_GenVarsT.Enabled != false) ||
        (((this->Uic).super_GenVarsT.Enabled & 1U) != 0)) ||
       (((this->Rcc).super_GenVarsT.Enabled == true && (this->MultiConfig == true)))) {
      cmGeneratorTarget::AddIncludeDirectory(this->Target,local_40,true);
    }
    bVar3 = InitScanFiles(this);
    if (bVar3) {
      if (((this->Moc).super_GenVarsT.Enabled != false) ||
         (((this->Uic).super_GenVarsT.Enabled & 1U) != 0)) {
        InitAutogenTarget(this);
      }
      if ((this->Rcc).super_GenVarsT.Enabled == true) {
        InitRccTargets(this);
        return true;
      }
      return true;
    }
  }
  return false;
}

Assistant:

bool cmQtAutoGenInitializer::InitCustomTargets()
{
  cmMakefile* makefile = this->Target->Target->GetMakefile();
  cmLocalGenerator* localGen = this->Target->GetLocalGenerator();
  cmGlobalGenerator* globalGen = localGen->GetGlobalGenerator();

  // Configurations
  this->MultiConfig = globalGen->IsMultiConfig();
  this->ConfigDefault = makefile->GetConfigurations(this->ConfigsList);
  if (this->ConfigsList.empty()) {
    this->ConfigsList.push_back(this->ConfigDefault);
  }

  // Verbosity
  this->Verbosity = makefile->GetSafeDefinition("CMAKE_AUTOGEN_VERBOSE");
  if (!this->Verbosity.empty()) {
    unsigned long iVerb = 0;
    if (!cmSystemTools::StringToULong(this->Verbosity.c_str(), &iVerb)) {
      // Non numeric verbosity
      this->Verbosity = cmSystemTools::IsOn(this->Verbosity) ? "1" : "0";
    }
  }

  // Targets FOLDER
  {
    const char* folder =
      makefile->GetState()->GetGlobalProperty("AUTOMOC_TARGETS_FOLDER");
    if (folder == nullptr) {
      folder =
        makefile->GetState()->GetGlobalProperty("AUTOGEN_TARGETS_FOLDER");
    }
    // Inherit FOLDER property from target (#13688)
    if (folder == nullptr) {
      folder = this->Target->GetProperty("FOLDER");
    }
    if (folder != nullptr) {
      this->TargetsFolder = folder;
    }
  }

  // Check status of policy CMP0071
  {
    cmPolicies::PolicyStatus const CMP0071_status =
      makefile->GetPolicyStatus(cmPolicies::CMP0071);
    switch (CMP0071_status) {
      case cmPolicies::WARN:
        this->CMP0071Warn = true;
        CM_FALLTHROUGH;
      case cmPolicies::OLD:
        // Ignore GENERATED file
        break;
      case cmPolicies::REQUIRED_IF_USED:
      case cmPolicies::REQUIRED_ALWAYS:
      case cmPolicies::NEW:
        // Process GENERATED file
        this->CMP0071Accept = true;
        break;
    }
  }

  // Common directories
  {
    // Collapsed current binary directory
    std::string const cbd = cmSystemTools::CollapseFullPath(
      std::string(), makefile->GetCurrentBinaryDirectory());

    // Info directory
    this->Dir.Info = cbd;
    this->Dir.Info += "/CMakeFiles";
    this->Dir.Info += '/';
    this->Dir.Info += this->Target->GetName();
    this->Dir.Info += "_autogen";
    this->Dir.Info += ".dir";
    cmSystemTools::ConvertToUnixSlashes(this->Dir.Info);

    // Build directory
    this->Dir.Build = this->Target->GetSafeProperty("AUTOGEN_BUILD_DIR");
    if (this->Dir.Build.empty()) {
      this->Dir.Build = cbd;
      this->Dir.Build += '/';
      this->Dir.Build += this->Target->GetName();
      this->Dir.Build += "_autogen";
    }
    cmSystemTools::ConvertToUnixSlashes(this->Dir.Build);
    // Cleanup build directory
    this->AddCleanFile(this->Dir.Build);

    // Working directory
    this->Dir.Work = cbd;
    cmSystemTools::ConvertToUnixSlashes(this->Dir.Work);

    // Include directory
    this->Dir.Include = this->Dir.Build;
    this->Dir.Include += "/include";
    if (this->MultiConfig) {
      this->Dir.Include += "_$<CONFIG>";
    }
    // Per config include directories
    if (this->MultiConfig) {
      for (std::string const& cfg : this->ConfigsList) {
        std::string& dir = this->Dir.ConfigInclude[cfg];
        dir = this->Dir.Build;
        dir += "/include_";
        dir += cfg;
      }
    }
  }

  // Moc, Uic and _autogen target settings
  if (this->MocOrUicEnabled()) {
    // Init moc specific settings
    if (this->Moc.Enabled && !InitMoc()) {
      return false;
    }

    // Init uic specific settings
    if (this->Uic.Enabled && !InitUic()) {
      return false;
    }

    // Autogen target name
    this->AutogenTarget.Name = this->Target->GetName();
    this->AutogenTarget.Name += "_autogen";

    // Autogen target parallel processing
    this->AutogenTarget.Parallel =
      this->Target->GetSafeProperty("AUTOGEN_PARALLEL");
    if (this->AutogenTarget.Parallel.empty() ||
        (this->AutogenTarget.Parallel == "AUTO")) {
      // Autodetect number of CPUs
      this->AutogenTarget.Parallel = std::to_string(GetParallelCPUCount());
    }

    // Autogen target info and settings files
    {
      this->AutogenTarget.InfoFile = this->Dir.Info;
      this->AutogenTarget.InfoFile += "/AutogenInfo.cmake";

      this->AutogenTarget.SettingsFile = this->Dir.Info;
      this->AutogenTarget.SettingsFile += "/AutogenOldSettings.txt";

      if (this->MultiConfig) {
        for (std::string const& cfg : this->ConfigsList) {
          std::string& filename = this->AutogenTarget.ConfigSettingsFile[cfg];
          filename =
            AppendFilenameSuffix(this->AutogenTarget.SettingsFile, "_" + cfg);
          this->AddCleanFile(filename);
        }
      } else {
        this->AddCleanFile(this->AutogenTarget.SettingsFile);
      }

      this->AutogenTarget.ParseCacheFile = this->Dir.Info;
      this->AutogenTarget.ParseCacheFile += "/ParseCache.txt";
      this->AddCleanFile(this->AutogenTarget.ParseCacheFile);
    }

    // Autogen target: Compute user defined dependencies
    {
      this->AutogenTarget.DependOrigin =
        this->Target->GetPropertyAsBool("AUTOGEN_ORIGIN_DEPENDS");

      std::string const deps =
        this->Target->GetSafeProperty("AUTOGEN_TARGET_DEPENDS");
      if (!deps.empty()) {
        std::vector<std::string> extraDeps;
        cmSystemTools::ExpandListArgument(deps, extraDeps);
        for (std::string const& depName : extraDeps) {
          // Allow target and file dependencies
          auto* depTarget = makefile->FindTargetToUse(depName);
          if (depTarget != nullptr) {
            this->AutogenTarget.DependTargets.insert(depTarget);
          } else {
            this->AutogenTarget.DependFiles.insert(depName);
          }
        }
      }
    }

    // CMAKE_AUTOMOC_RELAXED_MODE deprecation warning
    if (this->Moc.Enabled) {
      if (cmSystemTools::IsOn(
            makefile->GetDefinition("CMAKE_AUTOMOC_RELAXED_MODE"))) {
        std::string msg = "AUTOMOC: CMAKE_AUTOMOC_RELAXED_MODE is "
                          "deprecated an will be removed in the future.  ";
        msg += "Consider disabling it and converting the target ";
        msg += this->Target->GetName();
        msg += " to regular mode.";
        makefile->IssueMessage(MessageType::AUTHOR_WARNING, msg);
      }
    }
  }

  // Init rcc specific settings
  if (this->Rcc.Enabled && !InitRcc()) {
    return false;
  }

  // Add autogen include directory to the origin target INCLUDE_DIRECTORIES
  if (this->MocOrUicEnabled() || (this->Rcc.Enabled && this->MultiConfig)) {
    this->Target->AddIncludeDirectory(this->Dir.Include, true);
  }

  // Scan files
  if (!this->InitScanFiles()) {
    return false;
  }

  // Create autogen target
  if (this->MocOrUicEnabled() && !this->InitAutogenTarget()) {
    return false;
  }

  // Create rcc targets
  if (this->Rcc.Enabled && !this->InitRccTargets()) {
    return false;
  }

  return true;
}